

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeVarArray<Js::VarArrayVarCount>
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  size_t sVar7;
  Var pvVar8;
  Var number;
  double value_3;
  int8 value_2;
  int16 value_1;
  int value;
  byte code;
  byte *pbStack_50;
  uint index;
  byte *current;
  byte *content;
  VarArrayVarCount *pVStack_38;
  uint count;
  VarArrayVarCount *result;
  SerializedVarArray *serialized;
  ByteBlock *deserializeInto_local;
  byte *buffer_local;
  ScriptContext *scriptContext_local;
  ByteCodeBufferReader *this_local;
  
  uVar1 = *(uint *)buffer;
  result = (VarArrayVarCount *)buffer;
  serialized = (SerializedVarArray *)deserializeInto;
  deserializeInto_local = (ByteBlock *)buffer;
  buffer_local = (byte *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1261,
                                "(serialized->offset + sizeof(T) < deserializeInto->GetLength())",
                                "serialized->offset + sizeof(T) < deserializeInto->GetLength()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pbVar6 = ByteBlock::GetBuffer((ByteBlock *)serialized);
  pVStack_38 = (VarArrayVarCount *)(pbVar6 + *(uint *)&result->count);
  content._4_4_ = *(uint *)((long)&result->count + 5);
  VarArrayVarCount::SetCount(pVStack_38,content._4_4_);
  uVar1 = *(uint *)&result->count;
  sVar7 = VarArrayVarCount::GetDataSize(pVStack_38);
  uVar4 = ByteBlock::GetLength((ByteBlock *)serialized);
  if ((ulong)uVar4 < uVar1 + sVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x1265,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pbStack_50 = (byte *)((long)&result[1].count + 1);
  value = 0;
  current = pbStack_50;
  do {
    if (content._4_4_ <= (uint)value) {
      return pbStack_50;
    }
    pbStack_50 = ReadByte(this,pbStack_50,(byte *)((long)&value_1 + 1));
    switch(value_1._1_1_) {
    case 1:
      pbStack_50 = ReadByte(this,pbStack_50,(byte *)((long)&value_3 + 1));
      pvVar8 = TaggedInt::ToVarUnchecked((int)value_3._1_1_);
      pVStack_38[(ulong)(uint)value + 1].count = pvVar8;
      break;
    case 2:
      pbStack_50 = ReadConstantSizedInt16(this,pbStack_50,(int16 *)((long)&value_3 + 2));
      pvVar8 = TaggedInt::ToVarUnchecked((int)value_3._2_2_);
      pVStack_38[(ulong)(uint)value + 1].count = pvVar8;
      break;
    case 3:
      pbStack_50 = ReadConstantSizedInt32(this,pbStack_50,(int *)((long)&value_3 + 4));
      pvVar8 = TaggedInt::ToVarUnchecked(value_3._4_4_);
      pVStack_38[(ulong)(uint)value + 1].count = pvVar8;
      break;
    case 4:
      pbStack_50 = ReadDouble(this,pbStack_50,(double *)&number);
      pvVar8 = JavascriptNumber::New((double)number,(ScriptContext *)buffer_local);
      pVStack_38[(ulong)(uint)value + 1].count = pvVar8;
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x1291,"((0))","Unexpected object type in VarArray");
      if (bVar3) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    value = value + 1;
  } while( true );
}

Assistant:

const byte * DeserializeVarArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedVarArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxVarArray);
#endif
        Assert(serialized->offset + sizeof(T) < deserializeInto->GetLength());
        auto result = (T *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->varCount;
        result->SetCount(count);
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            byte code;
            current = ReadByte(current, &code);
            switch(code)
            {
                case ctInt32:
                    {
                        int value;
                        current = ReadConstantSizedInt32(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt16:
                    {
                        int16 value;
                        current = ReadConstantSizedInt16(current, &value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctInt8:
                    {
                        int8 value;
                        current = ReadByte(current, (byte *)&value);
                        result->elements[index] = Js::TaggedInt::ToVarUnchecked(value);
                        break;
                    }
                case ctNumber:
                    {
                        double value;
                        current = ReadDouble(current, &value);
                        const auto number = Js::JavascriptNumber::New(value, scriptContext);
#if !FLOATVAR
                        scriptContext->BindReference(number);
#endif
                        result->elements[index] = number;
                        break;
                    }

                default:
                    AssertMsg(UNREACHED, "Unexpected object type in VarArray");
                    Throw::FatalInternalError();
            }
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxVarArray);
#endif
        return current;
    }